

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O2

base_uint<256U> * __thiscall base_uint<256U>::operator=(base_uint<256U> *this,base_uint<256U> *b)

{
  long lVar1;
  int i;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this != b) {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      this->pn[lVar2] = b->pn[lVar2];
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator=(const base_uint& b)
    {
        if (this != &b) {
            for (int i = 0; i < WIDTH; i++)
                pn[i] = b.pn[i];
        }
        return *this;
    }